

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icrs2cirs.cpp
# Opt level: O3

void PrintResults(CESkyCoord *input,CESkyCoord *output,double jd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  double dVar5;
  double dVar6;
  vector<double,_std::allocator<double>_> output_hms;
  vector<double,_std::allocator<double>_> input_hms;
  CEAngle local_a8;
  CEDate local_98;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  
  dVar5 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar5,JD);
  (*input->_vptr_CESkyCoord[3])(&local_58,input,&local_98);
  CEAngle::HmsVect(&local_40,(CEAngle *)&local_58);
  CEAngle::~CEAngle((CEAngle *)&local_58);
  CEDate::~CEDate(&local_98);
  dVar5 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar5,JD);
  (*output->_vptr_CESkyCoord[3])(&local_a8,output,&local_98);
  CEAngle::HmsVect(&local_58,&local_a8);
  CEAngle::~CEAngle(&local_a8);
  CEDate::~CEDate(&local_98);
  putchar(10);
  puts("**********************************************");
  puts("* Results of ICRS -> CIRS                    *");
  puts("**********************************************");
  puts("CIRS Coordinates (output)");
  printf("    Julian Date    : %f\n",jd);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,0);
  dVar5 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,1);
  dVar1 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,2);
  dVar2 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,3);
  dVar3 = *pvVar4;
  dVar6 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar6,JD);
  (*output->_vptr_CESkyCoord[3])(&local_a8,output,&local_98);
  dVar6 = CEAngle::Deg(&local_a8);
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",dVar2 + dVar3,dVar6,
         (ulong)(uint)(int)dVar5,(ulong)(uint)(int)dVar1);
  CEAngle::~CEAngle(&local_a8);
  CEDate::~CEDate(&local_98);
  dVar5 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar5,JD);
  (*output->_vptr_CESkyCoord[4])(&local_a8,output,&local_98);
  CEAngle::Deg(&local_a8);
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(&local_a8);
  CEDate::~CEDate(&local_98);
  puts("ICRS Coordinates (input)");
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,0);
  dVar5 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,1);
  dVar1 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,2);
  dVar2 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,3);
  dVar3 = *pvVar4;
  dVar6 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar6,JD);
  (*input->_vptr_CESkyCoord[3])(&local_a8,input,&local_98);
  dVar6 = CEAngle::Deg(&local_a8);
  printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",dVar2 + dVar3,dVar6,
         (ulong)(uint)(int)dVar5,(ulong)(uint)(int)dVar1);
  CEAngle::~CEAngle(&local_a8);
  CEDate::~CEDate(&local_98);
  dVar5 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar5,JD);
  (*input->_vptr_CESkyCoord[4])(&local_a8,input,&local_98);
  CEAngle::Deg(&local_a8);
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(&local_a8);
  CEDate::~CEDate(&local_98);
  putchar(10);
  std::vector<double,_std::allocator<double>_>::~vector(&local_58);
  std::vector<double,_std::allocator<double>_>::~vector(&local_40);
  return;
}

Assistant:

void PrintResults(const  CESkyCoord& input,
                  const  CESkyCoord& output,
                  double jd)
{
    std::vector<double> input_hms = input.XCoord().HmsVect();
    std::vector<double> output_hms = output.XCoord().HmsVect();
    
    std::printf("\n") ;
    std::printf("**********************************************\n") ;
    std::printf("* Results of ICRS -> CIRS                    *\n") ;
    std::printf("**********************************************\n") ;
    std::printf("CIRS Coordinates (output)\n") ;
    std::printf("    Julian Date    : %f\n", jd) ;
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(output_hms[0]), int(output_hms[1]), output_hms[2]+output_hms[3],
                output.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", output.YCoord().Deg()) ;
    std::printf("ICRS Coordinates (input)\n") ;
    std::printf("    Right Ascension: %02dh %02dm %04.1fs (%f deg)\n",
                int(input_hms[0]), int(input_hms[1]), input_hms[2]+input_hms[3],
                input.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", input.YCoord().Deg()) ;
    std::printf("\n") ;
}